

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
RemoveHead<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *buffer;
  
  buffer = (this->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.node;
  if (buffer == (DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x158,"(!this->Empty())","!this->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    buffer = (this->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.
             node;
  }
  pDVar1 = (buffer->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.
           base;
  (((buffer->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).prev.base)->
  next).base = pDVar1;
  pDVar1->prev = (buffer->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).
                 prev;
  Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase(&buffer->data);
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x40);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, (Node *)node);

        this->DecrementCount();
    }